

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int init_finfo(void)

{
  FINFO *pFVar1;
  FINFO *pFVar2;
  int *piVar3;
  uint uVar4;
  
  FreeFinfoList = (FINFO *)calloc(0x340,0x400);
  if (FreeFinfoList != (FINFO *)0x0) {
    uVar4 = 0x401;
    pFVar1 = FreeFinfoList;
    do {
      pFVar2 = pFVar1;
      pFVar1 = (FINFO *)(pFVar2[1].no_ver_name + 0x10);
      pFVar2->prop = (FPROP *)(pFVar2 + 1);
      pFVar2->next = pFVar1;
      uVar4 = uVar4 - 1;
    } while (2 < uVar4);
    pFVar1->prop = (FPROP *)(pFVar2[2].no_ver_name + 0x10);
    pFVar2[2].no_ver_name[8] = '\0';
    pFVar2[2].no_ver_name[9] = '\0';
    pFVar2[2].no_ver_name[10] = '\0';
    pFVar2[2].no_ver_name[0xb] = '\0';
    pFVar2[2].no_ver_name[0xc] = '\0';
    pFVar2[2].no_ver_name[0xd] = '\0';
    pFVar2[2].no_ver_name[0xe] = '\0';
    pFVar2[2].no_ver_name[0xf] = '\0';
    FinfoArray = (DFINFO *)calloc(0x10,0x20);
    if (FinfoArray != (DFINFO *)0x0) {
      MAXFINFO = 0x20;
      return 1;
    }
  }
  piVar3 = __errno_location();
  *Lisp_errno = *piVar3;
  return 0;
}

Assistant:

int init_finfo(void) {
  FINFO *cp;
  int n;

  if ((FreeFinfoList = (FINFO *)calloc(sizeof(FINFO) + sizeof(FPROP), INITFINFONUM)) ==
      (FINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  for (cp = FreeFinfoList, n = INITFINFONUM; n > 1; n--) {
    cp->prop = (FPROP *)(cp + 1);
    cp->next = (FINFO *)((char *)cp + sizeof(FINFO) + sizeof(FPROP));
    cp = cp->next;
  }
  cp->prop = (FPROP *)(cp + 1);
  cp->next = (FINFO *)NULL;

  if ((FinfoArray = (DFINFO *)calloc(sizeof(DFINFO), INITFINFOARRAY)) == (DFINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  MAXFINFO = INITFINFOARRAY;

  return (1);
}